

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
ImageT<unsigned_char,_1U>::resample
          (ImageT<unsigned_char,_1U> *this,uint32_t targetWidth,uint32_t targetHeight,char *filter,
          float filterScale,Boundary_Op wrapMode)

{
  Color *pCVar1;
  format_args args;
  string_view fmt;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  pointer pIVar5;
  uint *puVar6;
  runtime_error *this_00;
  byte *pbVar7;
  reference pvVar8;
  reference pvVar9;
  pointer pRVar10;
  value_type pfVar11;
  reference ppfVar12;
  uchar *puVar13;
  int in_ECX;
  int iVar14;
  uint in_EDX;
  long in_RSI;
  v10 *this_01;
  __uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true> in_RDI;
  float fVar15;
  value_type vVar16;
  uchar unormValue;
  float outValue;
  float linearValue;
  uint32_t c_3;
  Color *targetPixel;
  uint32_t targetX;
  uint32_t c_2;
  array<const_float_*,_1UL> outputLine;
  uint32_t c_1;
  float value;
  uint32_t c;
  Color *sourcePixel;
  uint32_t sourceX;
  uint32_t sourceY;
  uint32_t targetY;
  TransferFunction *tf;
  TransferFunctionLinear tfLinear;
  TransferFunctionSRGB tfSRGB;
  uint32_t i;
  bool isHDR;
  array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_1UL> resamplers
  ;
  array<std::vector<float,_std::allocator<float>_>,_1UL> samples;
  uint32_t sourceHeight;
  uint32_t sourceWidth;
  __single_object target;
  unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *in_stack_fffffffffffffd08;
  array<std::vector<float,_std::allocator<float>_>,_1UL> *in_stack_fffffffffffffd10;
  unique_ptr<ImageT<unsigned_char,_1U>,_std::default_delete<ImageT<unsigned_char,_1U>_>_>
  *in_stack_fffffffffffffd18;
  array<std::vector<float,_std::allocator<float>_>,_1UL> *in_stack_fffffffffffffd20;
  undefined8 *__new_size;
  uint *in_stack_fffffffffffffd30;
  vector<float,_std::allocator<float>_> *this_02;
  uint *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  undefined1 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd59;
  undefined1 in_stack_fffffffffffffd5a;
  uchar uVar17;
  undefined1 in_stack_fffffffffffffd5b;
  undefined4 in_stack_fffffffffffffd5c;
  uint *in_stack_fffffffffffffd60;
  float *in_stack_fffffffffffffd80;
  long *plVar18;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  char **in_stack_fffffffffffffd90;
  long *pFilter;
  Resampler *in_stack_fffffffffffffd98;
  Contrib_List **in_stack_fffffffffffffda0;
  float *in_stack_fffffffffffffdc0;
  bool local_1fe;
  uint local_1e8;
  undefined1 local_1e0 [12];
  int local_1d4;
  float local_1d0;
  int local_1cc;
  color<unsigned_char,_1U> *local_1c8;
  uint local_1bc;
  uint local_1b8;
  int local_1b4;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  uint local_198;
  Boundary_Op local_194;
  undefined8 local_190;
  undefined1 local_188 [12];
  undefined8 local_17c;
  int local_170;
  undefined1 local_169;
  Contrib_List *local_168 [4];
  undefined1 local_141;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  local_140;
  char *local_130;
  string local_120 [32];
  uint local_100;
  uint local_fc [4];
  undefined1 local_ec [12];
  int local_e0;
  uint local_dc [5];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *local_c8 [3];
  undefined8 local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_a8;
  char *local_a0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  local_98;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  *local_90;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar19;
  string *args_00;
  char *pcVar20;
  
  local_e0 = in_ECX;
  local_dc[0] = in_EDX;
  std::make_unique<ImageT<unsigned_char,1u>,unsigned_int&,unsigned_int&>
            (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  pIVar5 = std::
           unique_ptr<ImageT<unsigned_char,_1U>,_std::default_delete<ImageT<unsigned_char,_1U>_>_>::
           operator->((unique_ptr<ImageT<unsigned_char,_1U>,_std::default_delete<ImageT<unsigned_char,_1U>_>_>
                       *)0x28baeb);
  Image::setTransferFunction(&pIVar5->super_Image,*(khr_df_transfer_e *)(in_RSI + 0x10));
  pIVar5 = std::
           unique_ptr<ImageT<unsigned_char,_1U>,_std::default_delete<ImageT<unsigned_char,_1U>_>_>::
           operator->((unique_ptr<ImageT<unsigned_char,_1U>,_std::default_delete<ImageT<unsigned_char,_1U>_>_>
                       *)0x28bb0b);
  Image::setPrimaries(&pIVar5->super_Image,*(khr_df_primaries_e *)(in_RSI + 0x14));
  local_fc[0] = *(uint *)(in_RSI + 8);
  local_100 = *(uint *)(in_RSI + 0xc);
  local_1fe = false;
  if (((local_fc[0] != 0) && (local_1fe = false, local_100 != 0)) &&
     (local_1fe = false, local_dc[0] != 0)) {
    local_1fe = local_e0 != 0;
  }
  if (!local_1fe) {
    __assert_fail("sourceWidth && sourceHeight && targetWidth && targetHeight",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x461,
                  "virtual std::unique_ptr<Image> ImageT<unsigned char, 1>::resample(uint32_t, uint32_t, const char *, float, basisu::Resampler::Boundary_Op) [componentType = unsigned char, componentCount = 1]"
                 );
  }
  this_01 = (v10 *)&local_100;
  puVar6 = std::max<unsigned_int>(local_fc,(uint *)this_01);
  if (*puVar6 < 0x4001) {
    this_01 = (v10 *)&local_e0;
    puVar6 = std::max<unsigned_int>(local_dc,(uint *)this_01);
    if (*puVar6 < 0x4001) {
      std::array<std::vector<float,_std::allocator<float>_>,_1UL>::array(in_stack_fffffffffffffd20);
      std::array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_1UL>::
      array((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_1UL>
             *)in_stack_fffffffffffffd20);
      local_169 = 0;
      for (local_170 = 0; local_170 == 0; local_170 = local_170 + 1) {
        local_17c._0_4_ = 0;
        local_188._8_4_ = 0x3f800000;
        local_188._0_8_ = (pointer)0x0;
        local_190 = 0;
        local_194 = BOUNDARY_WRAP;
        local_198 = 0;
        this_02 = (vector<float,_std::allocator<float>_> *)local_ec;
        __new_size = &local_190;
        in_stack_fffffffffffffd20 =
             (array<std::vector<float,_std::allocator<float>_>,_1UL> *)local_188;
        in_stack_fffffffffffffd18 =
             (unique_ptr<ImageT<unsigned_char,_1U>,_std::default_delete<ImageT<unsigned_char,_1U>_>_>
              *)(local_ec + 4);
        in_stack_fffffffffffffd10 =
             (array<std::vector<float,_std::allocator<float>_>,_1UL> *)(local_188 + 8);
        in_stack_fffffffffffffd08 =
             (unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)&local_17c;
        std::
        make_unique<basisu::Resampler,unsigned_int_const&,unsigned_int_const&,unsigned_int&,unsigned_int&,basisu::Resampler::Boundary_Op&,float,float,char_const*&,basisu::Resampler::Contrib_List*,basisu::Resampler::Contrib_List*,float&,float&,float,float>
                  (in_stack_fffffffffffffd60,
                   (uint *)CONCAT44(in_stack_fffffffffffffd5c,
                                    CONCAT13(in_stack_fffffffffffffd5b,
                                             CONCAT12(in_stack_fffffffffffffd5a,
                                                      CONCAT11(in_stack_fffffffffffffd59,
                                                               in_stack_fffffffffffffd58)))),
                   (uint *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),&local_198,
                   &local_194,in_stack_fffffffffffffd80,
                   (float *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                   in_stack_fffffffffffffd90,(Contrib_List **)in_stack_fffffffffffffd98,
                   in_stack_fffffffffffffda0,(float *)&stack0xfffffffffffffd08,(float *)0x0,
                   (float *)0x0,in_stack_fffffffffffffdc0);
        in_stack_fffffffffffffda0 = local_168;
        std::array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_1UL>
        ::operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_1UL>
                      *)in_stack_fffffffffffffd10,(size_type)in_stack_fffffffffffffd08);
        in_stack_fffffffffffffd98 = (Resampler *)((long)&local_17c + 4);
        std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::operator=
                  ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                   in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
        std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::~unique_ptr
                  ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                   in_stack_fffffffffffffd10);
        std::array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_1UL>
        ::operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_1UL>
                      *)in_stack_fffffffffffffd10,(size_type)in_stack_fffffffffffffd08);
        std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::operator*
                  ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                   in_stack_fffffffffffffd10);
        checkResamplerStatus(in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
        std::array<std::vector<float,_std::allocator<float>_>,_1UL>::operator[]
                  (in_stack_fffffffffffffd10,(size_type)in_stack_fffffffffffffd08);
        std::vector<float,_std::allocator<float>_>::resize(this_02,(size_type)__new_size);
      }
      TransferFunctionSRGB::TransferFunctionSRGB((TransferFunctionSRGB *)in_stack_fffffffffffffd10);
      TransferFunctionLinear::TransferFunctionLinear
                ((TransferFunctionLinear *)in_stack_fffffffffffffd10);
      if (*(int *)(in_RSI + 0x10) == 2) {
        pFilter = &local_1a0;
      }
      else {
        pFilter = &local_1a8;
      }
      local_1b4 = 0;
      local_1b0 = pFilter;
      for (local_1b8 = 0; local_1b8 < local_100; local_1b8 = local_1b8 + 1) {
        for (local_1bc = 0; local_1bc < local_fc[0]; local_1bc = local_1bc + 1) {
          local_1c8 = (color<unsigned_char,_1U> *)
                      (*(long *)(in_RSI + 0x18) + (ulong)(local_1b8 * local_fc[0] + local_1bc));
          for (local_1cc = 0; local_1cc == 0; local_1cc = local_1cc + 1) {
            pbVar7 = color<unsigned_char,_1U>::operator[](local_1c8,0);
            fVar15 = (float)*pbVar7;
            bVar3 = color_base<unsigned_char,_1U>::one();
            local_1d0 = fVar15 * (1.0 / (float)bVar3);
            plVar18 = local_1b0;
            if (local_1cc == 3) {
              plVar18 = &local_1a8;
            }
            vVar16 = (value_type)(**(code **)(*plVar18 + 8))(local_1d0);
            pvVar8 = std::array<std::vector<float,_std::allocator<float>_>,_1UL>::operator[]
                               (in_stack_fffffffffffffd10,(size_type)in_stack_fffffffffffffd08);
            pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](pvVar8,(ulong)local_1bc)
            ;
            *pvVar9 = vVar16;
          }
        }
        for (local_1d4 = 0; local_1d4 == 0; local_1d4 = local_1d4 + 1) {
          std::
          array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_1UL>::
          operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_1UL>
                      *)in_stack_fffffffffffffd10,(size_type)in_stack_fffffffffffffd08);
          pRVar10 = std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::
                    operator->((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                *)0x28c37b);
          pvVar8 = std::array<std::vector<float,_std::allocator<float>_>,_1UL>::operator[]
                             (in_stack_fffffffffffffd10,(size_type)in_stack_fffffffffffffd08);
          std::vector<float,_std::allocator<float>_>::operator[](pvVar8,0);
          bVar3 = basisu::Resampler::put_line((float *)pRVar10);
          if ((bVar3 & 1) == 0) {
            std::
            array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_1UL>
            ::operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_1UL>
                          *)in_stack_fffffffffffffd10,(size_type)in_stack_fffffffffffffd08);
            std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::operator*
                      ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                       in_stack_fffffffffffffd10);
            checkResamplerStatus(in_stack_fffffffffffffd98,(char *)pFilter);
          }
        }
        while( true ) {
          memset(local_1e0,0,8);
          bVar2 = false;
          while (!bVar2) {
            std::
            array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_1UL>
            ::operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_1UL>
                          *)in_stack_fffffffffffffd10,(size_type)in_stack_fffffffffffffd08);
            std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::operator->
                      ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                       0x28c454);
            pfVar11 = (value_type)basisu::Resampler::get_line();
            ppfVar12 = std::array<const_float_*,_1UL>::operator[]
                                 ((array<const_float_*,_1UL> *)in_stack_fffffffffffffd10,
                                  (size_type)in_stack_fffffffffffffd08);
            *ppfVar12 = pfVar11;
            bVar2 = true;
          }
          ppfVar12 = std::array<const_float_*,_1UL>::operator[]
                               ((array<const_float_*,_1UL> *)in_stack_fffffffffffffd10,
                                (size_type)in_stack_fffffffffffffd08);
          if (*ppfVar12 == (value_type)0x0) break;
          for (local_1e8 = 0; local_1e8 < local_dc[0]; local_1e8 = local_1e8 + 1) {
            pIVar5 = std::
                     unique_ptr<ImageT<unsigned_char,_1U>,_std::default_delete<ImageT<unsigned_char,_1U>_>_>
                     ::operator->((unique_ptr<ImageT<unsigned_char,_1U>,_std::default_delete<ImageT<unsigned_char,_1U>_>_>
                                   *)0x28c4dc);
            pCVar1 = pIVar5->pixels;
            iVar14 = local_1b4 * local_dc[0];
            bVar2 = false;
            while (!bVar2) {
              ppfVar12 = std::array<const_float_*,_1UL>::operator[]
                                   ((array<const_float_*,_1UL> *)in_stack_fffffffffffffd10,
                                    (size_type)in_stack_fffffffffffffd08);
              fVar15 = (float)(**(code **)*local_1b0)((*ppfVar12)[local_1e8]);
              uVar4 = std::isnan((double)(ulong)(uint)fVar15);
              if ((uVar4 & 1) == 0) {
                if (0.0 <= fVar15) {
                  if (fVar15 <= 1.0) {
                    bVar3 = color_base<unsigned_char,_1U>::one();
                    uVar17 = (uchar)(int)(fVar15 * (float)bVar3 + 0.5);
                  }
                  else {
                    uVar17 = color_base<unsigned_char,_1U>::one();
                  }
                }
                else {
                  uVar17 = '\0';
                }
              }
              else {
                uVar17 = '\0';
              }
              puVar13 = color<unsigned_char,_1U>::operator[](pCVar1 + (iVar14 + local_1e8),0);
              *puVar13 = uVar17;
              bVar2 = true;
            }
          }
          local_1b4 = local_1b4 + 1;
        }
      }
      std::unique_ptr<Image,std::default_delete<Image>>::
      unique_ptr<ImageT<unsigned_char,1u>,std::default_delete<ImageT<unsigned_char,1u>>,void>
                ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffffd20,
                 in_stack_fffffffffffffd18);
      TransferFunctionLinear::~TransferFunctionLinear((TransferFunctionLinear *)0x28c6e6);
      TransferFunctionSRGB::~TransferFunctionSRGB((TransferFunctionSRGB *)0x28c6f3);
      std::array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_1UL>::
      ~array((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_1UL>
              *)in_stack_fffffffffffffd20);
      std::array<std::vector<float,_std::allocator<float>_>,_1UL>::~array(in_stack_fffffffffffffd20)
      ;
      std::unique_ptr<ImageT<unsigned_char,_1U>,_std::default_delete<ImageT<unsigned_char,_1U>_>_>::
      ~unique_ptr((unique_ptr<ImageT<unsigned_char,_1U>,_std::default_delete<ImageT<unsigned_char,_1U>_>_>
                   *)in_stack_fffffffffffffd10);
      return (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)
             (tuple<Image_*,_std::default_delete<Image>_>)
             in_RDI.super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
             super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
             super__Head_base<0UL,_Image_*,_false>._M_head_impl;
    }
  }
  local_141 = 1;
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  pcVar20 = "Image larger than max supported size of {}";
  local_130 = "Image larger than max supported size of {}";
  local_98 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
              )std::char_traits<char>::length((char_type *)0x28bc76);
  local_140.int_value = 0x4000;
  args_00 = local_120;
  local_90 = &local_140;
  local_a0 = local_130;
  aVar19 = local_98;
  local_c8[0] = ::fmt::v10::
                make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,int>
                          ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int>
                            *)&local_90->string,this_01,(int *)args_00);
  local_a8 = local_c8;
  local_b0 = 1;
  fmt.size_ = (size_t)pcVar20;
  fmt.data_ = (char *)args_00;
  args.field_1.values_ = aVar19.values_;
  args.desc_ = (unsigned_long_long)local_130;
  ::fmt::v10::vformat_abi_cxx11_(fmt,args);
  std::runtime_error::runtime_error(this_00,local_120);
  local_141 = 0;
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual std::unique_ptr<Image> resample(uint32_t targetWidth, uint32_t targetHeight,
            const char* filter, float filterScale, basisu::Resampler::Boundary_Op wrapMode) override {
        using namespace basisu;

        auto target = std::make_unique<ImageT<componentType, componentCount>>(targetWidth, targetHeight);
        target->setTransferFunction(transferFunction);
        target->setPrimaries(primaries);

        const auto sourceWidth = width;
        const auto sourceHeight = height;
        assert(sourceWidth && sourceHeight && targetWidth && targetHeight);

        if (std::max(sourceWidth, sourceHeight) > BASISU_RESAMPLER_MAX_DIMENSION ||
                std::max(targetWidth, targetHeight) > BASISU_RESAMPLER_MAX_DIMENSION) {
            throw std::runtime_error(fmt::format(
                    "Image larger than max supported size of {}", BASISU_RESAMPLER_MAX_DIMENSION));
        }

        std::array<std::vector<float>, componentCount> samples;
        std::array<std::unique_ptr<Resampler>, componentCount> resamplers;

        // Float types handled as SFloat HDR otherwise UNROM LDR is assumed
        const auto isHDR = std::is_floating_point_v<componentType>;

        for (uint32_t i = 0; i < componentCount; ++i) {
            resamplers[i] = std::make_unique<Resampler>(
                    sourceWidth, sourceHeight,
                    targetWidth, targetHeight,
                    wrapMode,
                    0.0f, isHDR ? 0.0f : 1.0f,
                    filter,
                    i == 0 ? nullptr : resamplers[0]->get_clist_x(),
                    i == 0 ? nullptr : resamplers[0]->get_clist_y(),
                    filterScale, filterScale,
                    0.f, 0.f);
            checkResamplerStatus(*resamplers[i], filter);
            samples[i].resize(sourceWidth);
        }

        const TransferFunctionSRGB tfSRGB;
        const TransferFunctionLinear tfLinear;
        const TransferFunction& tf = transferFunction == KHR_DF_TRANSFER_SRGB ?
                static_cast<const TransferFunction&>(tfSRGB) :
                static_cast<const TransferFunction&>(tfLinear);

        uint32_t targetY = 0;
        for (uint32_t sourceY = 0; sourceY < sourceHeight; ++sourceY) {
            // Put source lines into resampler(s)
            for (uint32_t sourceX = 0; sourceX < sourceWidth; ++sourceX) {
                const auto& sourcePixel = pixels[sourceY * sourceWidth + sourceX];
                for (uint32_t c = 0; c < componentCount; ++c) {
                    const float value = std::is_floating_point_v<componentType> ?
                            sourcePixel[c] :
                            static_cast<float>(sourcePixel[c]) * (1.f / static_cast<float>(Color::one()));

                    // c == 3: Alpha channel always uses tfLinear
                    samples[c][sourceX] = (c == 3 ? tfLinear : tf).decode(value);
                }
            }

            for (uint32_t c = 0; c < componentCount; ++c)
                if (!resamplers[c]->put_line(&samples[c][0]))
                    checkResamplerStatus(*resamplers[c], filter);

            // Retrieve any output lines
            while (true) {
                std::array<const float*, componentCount> outputLine{nullptr};
                for (uint32_t c = 0; c < componentCount; ++c)
                    outputLine[c] = resamplers[c]->get_line();

                if (outputLine[0] == nullptr)
                    break; // No new output line, break from retrieve and place in a new source line

                for (uint32_t targetX = 0; targetX < targetWidth; ++targetX) {
                    Color& targetPixel = target->pixels[targetY * targetWidth + targetX];
                    for (uint32_t c = 0; c < componentCount; ++c) {
                        const auto linearValue = outputLine[c][targetX];

                        // c == 3: Alpha channel always uses tfLinear
                        const float outValue = (c == 3 ? tfLinear : tf).encode(linearValue);
                        if constexpr (std::is_floating_point_v<componentType>) {
                            targetPixel[c] = outValue;
                        } else {
                            const auto unormValue =
                                std::isnan(outValue) ? componentType{0} :
                                outValue < 0.f ? componentType{0} :
                                outValue > 1.f ? Color::one() :
                                static_cast<componentType>(outValue * static_cast<float>(Color::one()) + 0.5f);
                            targetPixel[c] = unormValue;
                        }
                    }
                }

                ++targetY;
            }
        }

        return target;
    }